

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<Assimp::FICDATAValue> __thiscall
Assimp::FICDATAValue::create(FICDATAValue *this,string *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FICDATAValue> sVar1;
  undefined1 local_28 [24];
  string *value_local;
  
  local_28._16_8_ = value;
  value_local = (string *)this;
  std::make_shared<Assimp::FICDATAValueImpl,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::shared_ptr<Assimp::FICDATAValue>::shared_ptr<Assimp::FICDATAValueImpl,void>
            ((shared_ptr<Assimp::FICDATAValue> *)this,
             (shared_ptr<Assimp::FICDATAValueImpl> *)local_28);
  std::shared_ptr<Assimp::FICDATAValueImpl>::~shared_ptr
            ((shared_ptr<Assimp::FICDATAValueImpl> *)local_28);
  sVar1.super___shared_ptr<Assimp::FICDATAValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FICDATAValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FICDATAValue>)
         sVar1.super___shared_ptr<Assimp::FICDATAValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FICDATAValue> FICDATAValue::create(std::string &&value) {
    return std::make_shared<FICDATAValueImpl>(std::move(value));
}